

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall capnp::LocalClient::~LocalClient(LocalClient *this)

{
  LocalClient *this_local;
  
  ~LocalClient(this);
  operator_delete(this,0x228);
  return;
}

Assistant:

~LocalClient() noexcept(false) {
    KJ_IF_SOME(s, server) {
      s->thisHook = kj::none;
    }
  }